

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamStandardIndex::Load(BamStandardIndex *this,string *filename)

{
  OpenFile(this,filename,ReadOnly);
  CheckMagicNumber(this);
  SummarizeIndexFile(this);
  return true;
}

Assistant:

bool BamStandardIndex::Load(const std::string& filename)
{

    try {

        // attempt to open file (read-only)
        OpenFile(filename, IBamIODevice::ReadOnly);

        // validate format
        CheckMagicNumber();

        // load in-memory summary of index data
        SummarizeIndexFile();

        // return success
        return true;

    } catch (BamException& e) {
        m_errorString = e.what();
        return false;
    }
}